

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::SizeStatistics::read(SizeStatistics *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t uVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  uint32_t _i9;
  TType _etype8;
  uint32_t _size5;
  uint32_t _i4;
  TType _etype3;
  uint32_t _size0;
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  undefined4 in_stack_ffffffffffffff18;
  TType in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  uint32_t in_stack_ffffffffffffff24;
  uint32_t in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff2c;
  uint32_t in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff34;
  size_type in_stack_ffffffffffffff38;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff40;
  uint local_6c;
  uint local_64;
  uint local_60;
  uint local_58;
  short local_46;
  int local_44;
  string local_40 [36];
  uint local_1c;
  size_type local_10;
  SizeStatistics *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  duckdb_apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
             ,(TProtocol *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::readStructBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_1c = uVar1 + local_1c;
  while( true ) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::readFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       (TType *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (int16_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_1c = uVar1 + local_1c;
    if (local_44 == 0) break;
    if (local_46 == 1) {
      if (local_44 == 10) {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::readI64
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           (int64_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
        ;
        local_1c = uVar1 + local_1c;
        this->__isset = (_SizeStatistics__isset)((byte)this->__isset & 0xfe | 1);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff1c);
        local_1c = uVar1 + local_1c;
      }
    }
    else if (local_46 == 2) {
      if (local_44 == 0xf) {
        duckdb::vector<long,_true>::clear((vector<long,_true> *)0x6f217d);
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::readListBegin
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           (TType *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                           (uint32_t *)0x6f219a);
        local_1c = local_1c + uVar1;
        std::vector<long,_std::allocator<long>_>::resize
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        for (local_60 = 0; local_60 < local_58; local_60 = local_60 + 1) {
          duckdb::vector<long,_true>::operator[]
                    ((vector<long,_true> *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          uVar1 = duckdb_apache::thrift::protocol::TProtocol::readI64
                            ((TProtocol *)
                             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                             (int64_t *)
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          local_1c = uVar1 + local_1c;
        }
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::readListEnd((TProtocol *)0x6f225a);
        local_1c = uVar1 + local_1c;
        this->__isset = (_SizeStatistics__isset)((byte)this->__isset & 0xfd | 2);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff1c);
        local_1c = uVar1 + local_1c;
      }
    }
    else if (local_46 == 3) {
      if (local_44 == 0xf) {
        duckdb::vector<long,_true>::clear((vector<long,_true> *)0x6f22d2);
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::readListBegin
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           (TType *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                           (uint32_t *)0x6f22ef);
        local_1c = local_1c + uVar1;
        std::vector<long,_std::allocator<long>_>::resize
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        for (local_6c = 0; local_6c < local_64; local_6c = local_6c + 1) {
          in_stack_ffffffffffffff38 = local_10;
          in_stack_ffffffffffffff40 =
               (vector<long,_std::allocator<long>_> *)
               duckdb::vector<long,_true>::operator[]
                         ((vector<long,_true> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          in_stack_ffffffffffffff34 =
               duckdb_apache::thrift::protocol::TProtocol::readI64
                         ((TProtocol *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                          ,(int64_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
          ;
          local_1c = in_stack_ffffffffffffff34 + local_1c;
        }
        in_stack_ffffffffffffff30 =
             duckdb_apache::thrift::protocol::TProtocol::readListEnd((TProtocol *)0x6f23a0);
        local_1c = in_stack_ffffffffffffff30 + local_1c;
        this->__isset = (_SizeStatistics__isset)((byte)this->__isset & 0xfb | 4);
      }
      else {
        in_stack_ffffffffffffff2c =
             duckdb_apache::thrift::protocol::TProtocol::skip
                       ((TProtocol *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff1c);
        local_1c = in_stack_ffffffffffffff2c + local_1c;
      }
    }
    else {
      in_stack_ffffffffffffff28 =
           duckdb_apache::thrift::protocol::TProtocol::skip
                     ((TProtocol *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff1c);
      local_1c = in_stack_ffffffffffffff28 + local_1c;
    }
    in_stack_ffffffffffffff24 =
         duckdb_apache::thrift::protocol::TProtocol::readFieldEnd((TProtocol *)0x6f2432);
    local_1c = in_stack_ffffffffffffff24 + local_1c;
  }
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::readStructEnd((TProtocol *)0x6f245c);
  uVar2 = uVar1 + local_1c;
  local_1c = uVar2;
  std::__cxx11::string::~string(local_40);
  duckdb_apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
            ((TInputRecursionTracker *)0x6f2499);
  return (ulong)uVar2;
}

Assistant:

uint32_t SizeStatistics::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->unencoded_byte_array_data_bytes);
          this->__isset.unencoded_byte_array_data_bytes = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->repetition_level_histogram.clear();
            uint32_t _size0;
            ::apache::thrift::protocol::TType _etype3;
            xfer += iprot->readListBegin(_etype3, _size0);
            this->repetition_level_histogram.resize(_size0);
            uint32_t _i4;
            for (_i4 = 0; _i4 < _size0; ++_i4)
            {
              xfer += iprot->readI64(this->repetition_level_histogram[_i4]);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.repetition_level_histogram = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->definition_level_histogram.clear();
            uint32_t _size5;
            ::apache::thrift::protocol::TType _etype8;
            xfer += iprot->readListBegin(_etype8, _size5);
            this->definition_level_histogram.resize(_size5);
            uint32_t _i9;
            for (_i9 = 0; _i9 < _size5; ++_i9)
            {
              xfer += iprot->readI64(this->definition_level_histogram[_i9]);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.definition_level_histogram = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}